

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::run(SSPMSolver *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int depth;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint n_bits;
  Game *pGVar13;
  
  pGVar13 = (this->super_Solver).game;
  uVar3 = pGVar13->n_vertices;
  iVar4 = *(int *)((long)pGVar13->_priority + ((long)((uVar3 << 0x20) + -0x100000000) >> 0x1e));
  uVar10 = (uint)((uVar3 - 1 & uVar3) != 0);
  uVar5 = 0x20;
  uVar11 = uVar3;
  for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 8) {
    uVar12 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar9) & uVar11) != 0) {
      uVar12 = uVar5;
    }
    uVar10 = uVar10 + (int)uVar12;
    uVar11 = uVar11 >> uVar12;
    uVar5 = uVar5 >> 1;
  }
  depth = iVar4 / 2 + 1;
  iVar4 = (iVar4 + 1) / 2;
  (this->Q).pointer = 0;
  puVar6 = (this->Q).queue;
  if (puVar6 != (uint *)0x0) {
    operator_delete__(puVar6);
    pGVar13 = (this->super_Solver).game;
  }
  puVar6 = (uint *)operator_new__((uVar3 & 0xffffffff) << 2);
  (this->Q).queue = puVar6;
  bitset::resize(&this->dirty,pGVar13->n_vertices);
  bitset::resize(&this->unstable,((this->super_Solver).game)->n_vertices);
  poVar7 = std::operator<<((this->super_Solver).logger,"even wants ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar10);
  poVar7 = std::operator<<(poVar7,"-bounded adaptive ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,depth);
  poVar7 = std::operator<<(poVar7,"-counters.");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((this->super_Solver).logger,"odd wants ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar10);
  poVar7 = std::operator<<(poVar7,"-bounded adaptive ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
  poVar7 = std::operator<<(poVar7,"-counters.");
  std::endl<char,std::char_traits<char>>(poVar7);
  n_bits = uVar10;
  if (this->bounded != false) {
    n_bits = 1;
  }
  for (; (int)n_bits <= (int)uVar10; n_bits = (n_bits - (lVar9 != lVar8)) + 1) {
    iVar1 = this->lift_count;
    iVar2 = this->lift_attempt;
    lVar9 = Game::count_unsolved((this->super_Solver).game);
    run(this,n_bits,iVar4,1);
    lVar8 = Game::count_unsolved((this->super_Solver).game);
    poVar7 = std::operator<<((this->super_Solver).logger,"after odd  with k=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
    poVar7 = std::operator<<(poVar7,", ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count - iVar1);
    poVar7 = std::operator<<(poVar7," lifts, ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt - iVar2);
    poVar7 = std::operator<<(poVar7," lift attempts, ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," unsolved left.");
    std::endl<char,std::char_traits<char>>(poVar7);
    if (lVar8 == 0) break;
    run(this,n_bits,depth,0);
    lVar8 = Game::count_unsolved((this->super_Solver).game);
    poVar7 = std::operator<<((this->super_Solver).logger,"after even with k=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
    poVar7 = std::operator<<(poVar7,", ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count - iVar1);
    poVar7 = std::operator<<(poVar7," lifts, ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt - iVar2);
    poVar7 = std::operator<<(poVar7," lift attempts, ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," unsolved left.");
    std::endl<char,std::char_traits<char>>(poVar7);
    if ((n_bits == uVar10) || (lVar8 == 0)) break;
  }
  poVar7 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count);
  poVar7 = std::operator<<(poVar7," lifts, ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt);
  poVar7 = std::operator<<(poVar7," lift attempts, max l ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
  poVar7 = std::operator<<(poVar7,".");
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void
SSPMSolver::run()
{
    int max_prio = priority(nodecount()-1);

    // compute ml (max l) and the h for even/odd
    int ml = ceil_log2(nodecount());
    int h0 = (max_prio/2)+1;
    int h1 = (max_prio+1)/2;

    // create datastructures
    Q.resize(nodecount());
    dirty.resize(nodecount());
    unstable.resize(nodecount());

    logger << "even wants " << ml << "-bounded adaptive " << h0 << "-counters." << std::endl;
    logger << "odd wants " << ml << "-bounded adaptive " << h1 << "-counters." << std::endl;

    // if running bounded sspm, start with 1-bounded adaptive counters
    int i = bounded ? 1 : ml;

    for (; i<=ml; i++) {
        int _l = lift_count, _a = lift_attempt;
        uint64_t _c = game.count_unsolved(), c;

        if (ODDFIRST) {
            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        } else {
            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        }

        if (i != ml) {
            // if i == ml then we are guaranteed to be done
            // otherwise check if done
            if (c == 0) break;
            if (_c != c) i--; // do not increase i if we solved vertices with current i
        } else {
            break; // do not count higher pls
        }
    }

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max l " << i << "." << std::endl;
}